

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O2

void ssh1mainchan_request_pty(SshChannel *sc,_Bool want_reply,Conf *conf,int w,int h)

{
  BinarySink *bs;
  long lVar1;
  char *str;
  long lVar2;
  undefined7 in_register_00000031;
  ssh_ttymodes *psVar3;
  undefined1 *puVar4;
  byte bVar5;
  undefined1 auStack_a68 [1308];
  undefined4 local_54c;
  ssh1_connection_state *local_548;
  ssh_ttymodes local_540;
  
  bVar5 = 0;
  local_54c = (undefined4)CONCAT71(in_register_00000031,want_reply);
  local_548 = (ssh1_connection_state *)(sc + -2);
  lVar1 = (*(code *)((sc[0xd].cl)->logctx->queue).tail)(10);
  bs = (BinarySink *)(lVar1 + 0x60);
  str = conf_get_str((Conf *)sc[-2].cl,0x35);
  BinarySink_put_stringz(bs,str);
  BinarySink_put_uint32(bs,(long)h);
  BinarySink_put_uint32(bs,(long)w);
  BinarySink_put_uint32(bs,0);
  BinarySink_put_uint32(bs,0);
  get_ttymodes_from_conf(&local_540,(Seat *)sc[0x11].cl,conf);
  psVar3 = &local_540;
  puVar4 = auStack_a68;
  for (lVar2 = 0x50c; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = psVar3->have_mode[0];
    psVar3 = (ssh_ttymodes *)((long)psVar3 + (ulong)bVar5 * -2 + 1);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  write_ttymodes_to_packet(bs,1);
  pq_base_push((PacketQueueBase *)sc[0xe].cl,(PacketQueueNode *)(lVar1 + 0x40));
  ssh1mainchan_queue_response(local_548,SUB41(local_54c,0),false);
  return;
}

Assistant:

static void ssh1mainchan_request_pty(
    SshChannel *sc, bool want_reply, Conf *conf, int w, int h)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_CMSG_REQUEST_PTY);
    put_stringz(pktout, conf_get_str(s->conf, CONF_termtype));
    put_uint32(pktout, h);
    put_uint32(pktout, w);
    put_uint32(pktout, 0); /* width in pixels */
    put_uint32(pktout, 0); /* height in pixels */
    write_ttymodes_to_packet(
        BinarySink_UPCAST(pktout), 1,
        get_ttymodes_from_conf(s->ppl.seat, conf));
    pq_push(s->ppl.out_pq, pktout);

    ssh1mainchan_queue_response(s, want_reply, false);
}